

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testapi.c
# Opt level: O0

int test_xmlRelaxNGValidatePushCData(void)

{
  int iVar1;
  int iVar2;
  xmlChar *val;
  uint local_3c;
  int local_38;
  int n_len;
  int len;
  int n_data;
  xmlChar *data;
  int n_ctxt;
  xmlRelaxNGValidCtxtPtr ctxt;
  int ret_val;
  int mem_base;
  int test_ret;
  
  ret_val = 0;
  for (data._4_4_ = 0; (int)data._4_4_ < 1; data._4_4_ = data._4_4_ + 1) {
    for (n_len = 0; n_len < 5; n_len = n_len + 1) {
      for (local_3c = 0; (int)local_3c < 4; local_3c = local_3c + 1) {
        iVar1 = xmlMemBlocks();
        val = gen_const_xmlChar_ptr(n_len,1);
        local_38 = gen_int(local_3c,2);
        if (val != (xmlChar *)0x0) {
          iVar2 = xmlStrlen(val);
          if (iVar2 < local_38) {
            local_38 = 0;
          }
        }
        iVar2 = xmlRelaxNGValidatePushCData(0,val,local_38);
        desret_int(iVar2);
        call_tests = call_tests + 1;
        des_const_xmlChar_ptr(n_len,val,1);
        des_int(local_3c,local_38,2);
        xmlResetLastError();
        iVar2 = xmlMemBlocks();
        if (iVar1 != iVar2) {
          iVar2 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlRelaxNGValidatePushCData",
                 (ulong)(uint)(iVar2 - iVar1));
          ret_val = ret_val + 1;
          printf(" %d",(ulong)data._4_4_);
          printf(" %d",(ulong)(uint)n_len);
          printf(" %d",(ulong)local_3c);
          printf("\n");
        }
      }
    }
  }
  function_tests = function_tests + 1;
  return ret_val;
}

Assistant:

static int
test_xmlRelaxNGValidatePushCData(void) {
    int test_ret = 0;

#if defined(LIBXML_RELAXNG_ENABLED)
    int mem_base;
    int ret_val;
    xmlRelaxNGValidCtxtPtr ctxt; /* the RelaxNG validation context */
    int n_ctxt;
    const xmlChar * data; /* some character data read */
    int n_data;
    int len; /* the length of the data */
    int n_len;

    for (n_ctxt = 0;n_ctxt < gen_nb_xmlRelaxNGValidCtxtPtr;n_ctxt++) {
    for (n_data = 0;n_data < gen_nb_const_xmlChar_ptr;n_data++) {
    for (n_len = 0;n_len < gen_nb_int;n_len++) {
        mem_base = xmlMemBlocks();
        ctxt = gen_xmlRelaxNGValidCtxtPtr(n_ctxt, 0);
        data = gen_const_xmlChar_ptr(n_data, 1);
        len = gen_int(n_len, 2);
        if ((data != NULL) &&
            (len > xmlStrlen(BAD_CAST data)))
            len = 0;

        ret_val = xmlRelaxNGValidatePushCData(ctxt, data, len);
        desret_int(ret_val);
        call_tests++;
        des_xmlRelaxNGValidCtxtPtr(n_ctxt, ctxt, 0);
        des_const_xmlChar_ptr(n_data, data, 1);
        des_int(n_len, len, 2);
        xmlResetLastError();
        if (mem_base != xmlMemBlocks()) {
            printf("Leak of %d blocks found in xmlRelaxNGValidatePushCData",
	           xmlMemBlocks() - mem_base);
	    test_ret++;
            printf(" %d", n_ctxt);
            printf(" %d", n_data);
            printf(" %d", n_len);
            printf("\n");
        }
    }
    }
    }
    function_tests++;
#endif

    return(test_ret);
}